

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# outchars.c
# Opt level: O3

nh_bool apply_override_list(curses_symdef_conflict *list,wchar_t len,curses_symdef_conflict *ovr,
                           nh_bool cust)

{
  undefined8 *puVar1;
  char *__s2;
  undefined8 uVar2;
  int iVar3;
  long lVar4;
  
  if (len < L'\x01') {
    return '\0';
  }
  __s2 = ovr->symname;
  lVar4 = 0;
  do {
    iVar3 = strcmp(*(char **)((long)list->unichar + lVar4 + -0xc),__s2);
    if (iVar3 == 0) {
      if (ovr->unichar[0] != L'\0') {
        *(wchar_t *)((long)list->unichar + lVar4 + 0x10) = ovr->unichar[4];
        uVar2 = *(undefined8 *)(ovr->unichar + 2);
        puVar1 = (undefined8 *)((long)list->unichar + lVar4);
        *puVar1 = *(undefined8 *)ovr->unichar;
        puVar1[1] = uVar2;
      }
      if (ovr->ch != 0) {
        *(short *)((long)list->unichar + lVar4 + 0x18) = ovr->ch;
      }
      if (ovr->color != -1) {
        *(int *)((long)list->unichar + lVar4 + -4) = ovr->color;
      }
      *(nh_bool *)((long)list->unichar + lVar4 + 0x1a) = cust;
      return '\x01';
    }
    lVar4 = lVar4 + 0x28;
  } while ((ulong)(uint)len * 0x28 != lVar4);
  return '\0';
}

Assistant:

static nh_bool apply_override_list(struct curses_symdef *list, int len,
				   const struct curses_symdef *ovr, nh_bool cust)
{
    int i;
    for (i = 0; i < len; i++)
	if (!strcmp(list[i].symname, ovr->symname)) {
	    if (ovr->unichar[0])
		memcpy(list[i].unichar, ovr->unichar, sizeof(wchar_t) * CCHARW_MAX);
	    if (ovr->ch)
		list[i].ch = ovr->ch;
	    if (ovr->color != -1)
		list[i].color = ovr->color;
	    list[i].custom = cust;
	    return TRUE;
	}
    return FALSE;
}